

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryFileFormat.cpp
# Opt level: O3

int __thiscall pbrt::PixelFilter::writeTo(PixelFilter *this,BinaryWriter *binary)

{
  int filterType;
  undefined1 local_14 [4];
  
  BinaryWriter::writeRaw(binary,local_14,4);
  BinaryWriter::writeRaw(binary,&this->radius,4);
  BinaryWriter::writeRaw(binary,&this->alpha,4);
  return 0x50;
}

Assistant:

int PixelFilter::writeTo(BinaryWriter &binary)  {
    int filterType = static_cast<int>(type);
    binary.write(filterType);
    binary.write(radius);
    binary.write(alpha);
    return TYPE_PIXEL_FILTER;
}